

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqstate.cpp
# Opt level: O2

SQTable * CreateDefaultDelegate(SQSharedState *ss,SQRegFunction *funcz)

{
  bool bVar1;
  SQTable *this;
  SQNativeClosure *x;
  SQString *pSVar2;
  SQObjectPtr local_50;
  SQObjectPtr local_40;
  
  this = SQTable::Create(ss,0);
  while( true ) {
    if (funcz->name == (SQChar *)0x0) {
      return this;
    }
    x = SQNativeClosure::Create(ss,funcz->f,0);
    x->_nparamscheck = funcz->nparamscheck;
    pSVar2 = SQString::Create(ss,funcz->name,-1);
    SQObjectPtr::operator=(&x->_name,pSVar2);
    if ((funcz->typemask != (SQChar *)0x0) &&
       (bVar1 = CompileTypemask(&x->_typecheck,funcz->typemask), !bVar1)) break;
    pSVar2 = SQString::Create(ss,funcz->name,-1);
    SQObjectPtr::SQObjectPtr(&local_40,pSVar2);
    SQObjectPtr::SQObjectPtr(&local_50,x);
    SQTable::NewSlot(this,&local_40,&local_50);
    SQObjectPtr::~SQObjectPtr(&local_50);
    SQObjectPtr::~SQObjectPtr(&local_40);
    funcz = funcz + 1;
  }
  return (SQTable *)0x0;
}

Assistant:

SQTable *CreateDefaultDelegate(SQSharedState *ss,const SQRegFunction *funcz)
{
    SQInteger i=0;
    SQTable *t=SQTable::Create(ss,0);
    while(funcz[i].name!=0){
        SQNativeClosure *nc = SQNativeClosure::Create(ss,funcz[i].f,0);
        nc->_nparamscheck = funcz[i].nparamscheck;
        nc->_name = SQString::Create(ss,funcz[i].name);
        if(funcz[i].typemask && !CompileTypemask(nc->_typecheck,funcz[i].typemask))
            return NULL;
        t->NewSlot(SQString::Create(ss,funcz[i].name),nc);
        i++;
    }
    return t;
}